

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

Value __thiscall xmrig::Pool::toJSON(Pool *this,Document *doc)

{
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  String *in_RSI;
  undefined8 in_RDI;
  Value VVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *obj;
  char *in_stack_fffffffffffffe78;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_158 [2];
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  StringRefType *in_stack_fffffffffffffed8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffee0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_118 [6];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_b8 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_98 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_78 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_58 [3];
  undefined1 local_21;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  local_21 = 0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)CONCAT17(in_stack_fffffffffffffe87,
                           CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)),
               (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
  url((Pool *)0x1cff55);
  String::toJSON(in_RSI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
            in_stack_fffffffffffffec8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(local_58);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
  String::toJSON(in_RSI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
            in_stack_fffffffffffffec8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(local_78);
  if (*(int *)((long)&in_RSI->m_data + 4) != 1) {
    rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
    String::toJSON(in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
              in_stack_fffffffffffffec8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(local_98);
    rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
    String::toJSON(in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
              in_stack_fffffffffffffec8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(local_b8);
    if ((*(int *)&in_RSI->m_data == 0) || (*(int *)&in_RSI->m_data == 0x3c)) {
      rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<bool>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        SUB41((uint)in_stack_fffffffffffffed4 >> 0x18,0),in_stack_fffffffffffffec8);
    }
    else {
      rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<int>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4
                       ,in_stack_fffffffffffffec8);
    }
  }
  rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
  std::bitset<2UL>::test
            ((bitset<2UL> *)
             CONCAT17(in_stack_fffffffffffffe87,
                      CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)),
             (size_t)in_stack_fffffffffffffe78);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                  SUB41((uint)in_stack_fffffffffffffed4 >> 0x18,0),in_stack_fffffffffffffec8);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
  isTLS((Pool *)0x1d028d);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                  SUB41((uint)in_stack_fffffffffffffed4 >> 0x18,0),in_stack_fffffffffffffec8);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
  String::toJSON(in_RSI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
            in_stack_fffffffffffffec8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(local_118);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                  SUB41((uint)in_stack_fffffffffffffed4 >> 0x18,0),in_stack_fffffffffffffec8);
  if (*(int *)((long)&in_RSI->m_data + 4) == 1) {
    rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    uVar1 = extraout_RDX;
  }
  else {
    rapidjson::StringRef<char>(in_stack_fffffffffffffe78);
    Url::url((Url *)&in_RSI[5].m_size);
    String::toJSON(in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
              in_stack_fffffffffffffec8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(local_158);
    uVar1 = extraout_RDX_00;
  }
  VVar2.data_.s.str = (Ch *)uVar1;
  VVar2.data_.n = (Number)in_RDI;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::Pool::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;

    auto &allocator = doc.GetAllocator();

    Value obj(kObjectType);

    obj.AddMember(StringRef(kUrl),   url().toJSON(), allocator);
    obj.AddMember(StringRef(kUser),  m_user.toJSON(), allocator);

    if (m_mode != MODE_DAEMON) {
        obj.AddMember(StringRef(kPass),  m_password.toJSON(), allocator);
        obj.AddMember(StringRef(kRigId), m_rigId.toJSON(), allocator);

        if (m_keepAlive == 0 || m_keepAlive == kKeepAliveTimeout) {
            obj.AddMember(StringRef(kKeepalive), m_keepAlive > 0, allocator);
        }
        else {
            obj.AddMember(StringRef(kKeepalive), m_keepAlive, allocator);
        }
    }

    obj.AddMember(StringRef(kEnabled),            m_flags.test(FLAG_ENABLED), allocator);
    obj.AddMember(StringRef(kTls),                isTLS(), allocator);
    obj.AddMember(StringRef(kFingerprint),        m_fingerprint.toJSON(), allocator);
    obj.AddMember(StringRef(kDaemon),             m_mode == MODE_DAEMON, allocator);

    if (m_mode == MODE_DAEMON) {
        obj.AddMember(StringRef(kDaemonPollInterval), m_pollInterval, allocator);
    }
    else {
        obj.AddMember(StringRef(kSelfSelect), m_daemon.url().toJSON(), allocator);
    }

    return obj;
}